

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcPrint.c
# Opt level: O0

void Abc_NtkPrintFanioNew(FILE *pFile,Abc_Ntk_t *pNtk,int fMffc)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Abc_Obj_t *pAVar4;
  Vec_Int_t *p;
  Vec_Int_t *p_00;
  double dVar5;
  double dVar6;
  uint local_c0;
  int nSizeMax;
  int k;
  int i;
  int nFanoutsAll;
  int nFaninsAll;
  int nFanoutsMax;
  int nFaninsMax;
  int nFanouts;
  int nFanins;
  Vec_Int_t *vFanouts;
  Vec_Int_t *vFanins;
  Abc_Obj_t *pNode;
  char Buffer [100];
  int fMffc_local;
  Abc_Ntk_t *pNtk_local;
  FILE *pFile_local;
  
  nFanoutsAll = 0;
  nFaninsAll = 0;
  k = 0;
  i = 0;
  for (nSizeMax = 0; iVar1 = Vec_PtrSize(pNtk->vObjs), nSizeMax < iVar1; nSizeMax = nSizeMax + 1) {
    pAVar4 = Abc_NtkObj(pNtk,nSizeMax);
    if (((pAVar4 != (Abc_Obj_t *)0x0) && (iVar1 = Abc_ObjIsNode(pAVar4), iVar1 != 0)) &&
       ((fMffc == 0 || (iVar1 = Abc_ObjFanoutNum(pAVar4), iVar1 != 1)))) {
      iVar1 = Abc_ObjFaninNum(pAVar4);
      iVar2 = Abc_NtkIsNetlist(pNtk);
      if (iVar2 == 0) {
        if (fMffc == 0) {
          nFanoutsMax = Abc_ObjFanoutNum(pAVar4);
        }
        else {
          nFanoutsMax = Abc_NodeMffcSize(pAVar4);
        }
      }
      else {
        pAVar4 = Abc_ObjFanout0(pAVar4);
        nFanoutsMax = Abc_ObjFanoutNum(pAVar4);
      }
      i = iVar1 + i;
      k = nFanoutsMax + k;
      nFaninsAll = Abc_MaxInt(nFaninsAll,iVar1);
      nFanoutsAll = Abc_MaxInt(nFanoutsAll,nFanoutsMax);
    }
  }
  iVar1 = Abc_Base10Log(nFaninsAll);
  iVar2 = Abc_Base10Log(nFanoutsAll);
  iVar1 = Abc_MaxInt((iVar1 + 1) * 10,(iVar2 + 1) * 10);
  p = Vec_IntStart(iVar1);
  p_00 = Vec_IntStart(iVar1);
  for (nSizeMax = 0; iVar2 = Vec_PtrSize(pNtk->vObjs), nSizeMax < iVar2; nSizeMax = nSizeMax + 1) {
    pAVar4 = Abc_NtkObj(pNtk,nSizeMax);
    if (((pAVar4 != (Abc_Obj_t *)0x0) && (iVar2 = Abc_ObjIsNode(pAVar4), iVar2 != 0)) &&
       ((fMffc == 0 || (iVar2 = Abc_ObjFanoutNum(pAVar4), iVar2 != 1)))) {
      iVar2 = Abc_ObjFaninNum(pAVar4);
      iVar3 = Abc_NtkIsNetlist(pNtk);
      if (iVar3 == 0) {
        if (fMffc == 0) {
          nFanoutsMax = Abc_ObjFanoutNum(pAVar4);
        }
        else {
          nFanoutsMax = Abc_NodeMffcSize(pAVar4);
        }
      }
      else {
        pAVar4 = Abc_ObjFanout0(pAVar4);
        nFanoutsMax = Abc_ObjFanoutNum(pAVar4);
      }
      if (iVar2 < 10) {
        Vec_IntAddToEntry(p,iVar2,1);
      }
      else if (iVar2 < 100) {
        Vec_IntAddToEntry(p,iVar2 / 10 + 10,1);
      }
      else if (iVar2 < 1000) {
        Vec_IntAddToEntry(p,iVar2 / 100 + 0x14,1);
      }
      else if (iVar2 < 10000) {
        Vec_IntAddToEntry(p,iVar2 / 1000 + 0x1e,1);
      }
      else if (iVar2 < 100000) {
        Vec_IntAddToEntry(p,iVar2 / 10000 + 0x28,1);
      }
      else if (iVar2 < 1000000) {
        Vec_IntAddToEntry(p,iVar2 / 100000 + 0x32,1);
      }
      else if (iVar2 < 10000000) {
        Vec_IntAddToEntry(p,iVar2 / 1000000 + 0x3c,1);
      }
      if (nFanoutsMax < 10) {
        Vec_IntAddToEntry(p_00,nFanoutsMax,1);
      }
      else if (nFanoutsMax < 100) {
        Vec_IntAddToEntry(p_00,nFanoutsMax / 10 + 10,1);
      }
      else if (nFanoutsMax < 1000) {
        Vec_IntAddToEntry(p_00,nFanoutsMax / 100 + 0x14,1);
      }
      else if (nFanoutsMax < 10000) {
        Vec_IntAddToEntry(p_00,nFanoutsMax / 1000 + 0x1e,1);
      }
      else if (nFanoutsMax < 100000) {
        Vec_IntAddToEntry(p_00,nFanoutsMax / 10000 + 0x28,1);
      }
      else if (nFanoutsMax < 1000000) {
        Vec_IntAddToEntry(p_00,nFanoutsMax / 100000 + 0x32,1);
      }
      else if (nFanoutsMax < 10000000) {
        Vec_IntAddToEntry(p_00,nFanoutsMax / 1000000 + 0x3c,1);
      }
    }
  }
  fprintf((FILE *)pFile,"The distribution of fanins and fanouts in the network:\n");
  fprintf((FILE *)pFile,"         Number   Nodes with fanin  Nodes with fanout\n");
  for (local_c0 = 0; (int)local_c0 < iVar1; local_c0 = local_c0 + 1) {
    if ((p->pArray[(int)local_c0] != 0) || (p_00->pArray[(int)local_c0] != 0)) {
      if ((int)local_c0 < 10) {
        fprintf((FILE *)pFile,"%15d : ",(ulong)local_c0);
      }
      else {
        dVar5 = pow(10.0,(double)((int)local_c0 / 10));
        dVar6 = pow(10.0,(double)((int)local_c0 / 10));
        sprintf((char *)&pNode,"%d - %d",(ulong)(uint)((int)dVar5 * ((int)local_c0 % 10)),
                (ulong)((int)dVar6 * ((int)local_c0 % 10 + 1) - 1));
        fprintf((FILE *)pFile,"%15s : ",&pNode);
      }
      if (p->pArray[(int)local_c0] == 0) {
        fprintf((FILE *)pFile,"              ");
      }
      else {
        fprintf((FILE *)pFile,"%12d  ",(ulong)(uint)p->pArray[(int)local_c0]);
      }
      fprintf((FILE *)pFile,"    ");
      if (p_00->pArray[(int)local_c0] == 0) {
        fprintf((FILE *)pFile,"              ");
      }
      else {
        fprintf((FILE *)pFile,"%12d  ",(ulong)(uint)p_00->pArray[(int)local_c0]);
      }
      fprintf((FILE *)pFile,"\n");
    }
  }
  Vec_IntFree(p);
  Vec_IntFree(p_00);
  iVar1 = Abc_NtkNodeNum(pNtk);
  iVar2 = Abc_NtkNodeNum(pNtk);
  fprintf((FILE *)pFile,"Fanins: Max = %d. Ave = %.2f.  Fanouts: Max = %d. Ave =  %.2f.\n",
          ((double)i * 1.0) / (double)iVar1,((double)k * 1.0) / (double)iVar2,
          (ulong)(uint)nFaninsAll,(ulong)(uint)nFanoutsAll);
  return;
}

Assistant:

void Abc_NtkPrintFanioNew( FILE * pFile, Abc_Ntk_t * pNtk, int fMffc )
{
    char Buffer[100];
    Abc_Obj_t * pNode;
    Vec_Int_t * vFanins, * vFanouts;
    int nFanins, nFanouts, nFaninsMax, nFanoutsMax, nFaninsAll, nFanoutsAll;
    int i, k, nSizeMax;

    // determine the largest fanin and fanout
    nFaninsMax = nFanoutsMax = 0;
    nFaninsAll = nFanoutsAll = 0;
    Abc_NtkForEachNode( pNtk, pNode, i )
    {
        if ( fMffc && Abc_ObjFanoutNum(pNode) == 1 )
            continue;
        nFanins  = Abc_ObjFaninNum(pNode);
        if ( Abc_NtkIsNetlist(pNtk) )
            nFanouts = Abc_ObjFanoutNum( Abc_ObjFanout0(pNode) );
        else if ( fMffc )
            nFanouts = Abc_NodeMffcSize(pNode);
        else
            nFanouts = Abc_ObjFanoutNum(pNode);
        nFaninsAll  += nFanins;
        nFanoutsAll += nFanouts;
        nFaninsMax   = Abc_MaxInt( nFaninsMax, nFanins );
        nFanoutsMax  = Abc_MaxInt( nFanoutsMax, nFanouts );
    }

    // allocate storage for fanin/fanout numbers
    nSizeMax = Abc_MaxInt( 10 * (Abc_Base10Log(nFaninsMax) + 1), 10 * (Abc_Base10Log(nFanoutsMax) + 1) );
    vFanins  = Vec_IntStart( nSizeMax );
    vFanouts = Vec_IntStart( nSizeMax );

    // count the number of fanins and fanouts
    Abc_NtkForEachNode( pNtk, pNode, i )
    {
        if ( fMffc && Abc_ObjFanoutNum(pNode) == 1 )
            continue;
        nFanins  = Abc_ObjFaninNum(pNode);
        if ( Abc_NtkIsNetlist(pNtk) )
            nFanouts = Abc_ObjFanoutNum( Abc_ObjFanout0(pNode) );
        else if ( fMffc )
            nFanouts = Abc_NodeMffcSize(pNode);
        else
            nFanouts = Abc_ObjFanoutNum(pNode);

        if ( nFanins < 10 )
            Vec_IntAddToEntry( vFanins, nFanins, 1 );
        else if ( nFanins < 100 )
            Vec_IntAddToEntry( vFanins, 10 + nFanins/10, 1 );
        else if ( nFanins < 1000 )
            Vec_IntAddToEntry( vFanins, 20 + nFanins/100, 1 );
        else if ( nFanins < 10000 )
            Vec_IntAddToEntry( vFanins, 30 + nFanins/1000, 1 );
        else if ( nFanins < 100000 )
            Vec_IntAddToEntry( vFanins, 40 + nFanins/10000, 1 );
        else if ( nFanins < 1000000 )
            Vec_IntAddToEntry( vFanins, 50 + nFanins/100000, 1 );
        else if ( nFanins < 10000000 )
            Vec_IntAddToEntry( vFanins, 60 + nFanins/1000000, 1 );

        if ( nFanouts < 10 )
            Vec_IntAddToEntry( vFanouts, nFanouts, 1 );
        else if ( nFanouts < 100 )
            Vec_IntAddToEntry( vFanouts, 10 + nFanouts/10, 1 );
        else if ( nFanouts < 1000 )
            Vec_IntAddToEntry( vFanouts, 20 + nFanouts/100, 1 );
        else if ( nFanouts < 10000 )
            Vec_IntAddToEntry( vFanouts, 30 + nFanouts/1000, 1 );
        else if ( nFanouts < 100000 )
            Vec_IntAddToEntry( vFanouts, 40 + nFanouts/10000, 1 );
        else if ( nFanouts < 1000000 )
            Vec_IntAddToEntry( vFanouts, 50 + nFanouts/100000, 1 );
        else if ( nFanouts < 10000000 )
            Vec_IntAddToEntry( vFanouts, 60 + nFanouts/1000000, 1 );
    }

    fprintf( pFile, "The distribution of fanins and fanouts in the network:\n" );
    fprintf( pFile, "         Number   Nodes with fanin  Nodes with fanout\n" );
    for ( k = 0; k < nSizeMax; k++ )
    {
        if ( vFanins->pArray[k] == 0 && vFanouts->pArray[k] == 0 )
            continue;
        if ( k < 10 )
            fprintf( pFile, "%15d : ", k );
        else
        {
            sprintf( Buffer, "%d - %d", (int)pow((double)10, k/10) * (k%10), (int)pow((double)10, k/10) * (k%10+1) - 1 );
            fprintf( pFile, "%15s : ", Buffer );
        }
        if ( vFanins->pArray[k] == 0 )
            fprintf( pFile, "              " );
        else
            fprintf( pFile, "%12d  ", vFanins->pArray[k] );
        fprintf( pFile, "    " );
        if ( vFanouts->pArray[k] == 0 )
            fprintf( pFile, "              " );
        else
            fprintf( pFile, "%12d  ", vFanouts->pArray[k] );
        fprintf( pFile, "\n" );
    }
    Vec_IntFree( vFanins );
    Vec_IntFree( vFanouts );

    fprintf( pFile, "Fanins: Max = %d. Ave = %.2f.  Fanouts: Max = %d. Ave =  %.2f.\n",
        nFaninsMax,  1.0*nFaninsAll/Abc_NtkNodeNum(pNtk),
        nFanoutsMax, 1.0*nFanoutsAll/Abc_NtkNodeNum(pNtk)  );
/*
    Abc_NtkForEachCi( pNtk, pNode, i )
    {
        printf( "%d ", Abc_ObjFanoutNum(pNode) );
    }
    printf( "\n" );
*/
}